

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O2

int drawDisplayStringList(void)

{
  char cVar1;
  int y;
  int x;
  char *c;
  char *pcVar2;
  
  drawMap();
  y = display_string_list_line_count * -6 + 0x40 >> 1;
  fillBox(3,y + -2,0x7c,display_string_list_line_count * 6 + 5,0xff);
  fillBox(4,y + -1,0x7a,display_string_list_line_count * 6 + 2,'\0');
  pcVar2 = display_string_list_buffer;
  x = 5;
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '\n') {
      y = y + 6;
      x = 5;
    }
    else {
      if (cVar1 == '\0') {
        return y;
      }
      drawChar(x,y,(int)cVar1);
      x = x + 4;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

static int drawDisplayStringList()
{
    drawMap();
    int w = 30 * 4;
    int x = 5;
    int sx = x;
    int y = (DISPLAY_HEIGHT-display_string_list_line_count*6) / 2;
    fillBox(x - 2, y - 2, w + 4, display_string_list_line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, w + 2, display_string_list_line_count * 6 + 2, 0);
    for(char* c=display_string_list_buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x+=4;
        }
    }
    return y;
}